

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int bid_keyword_list(char *p,ssize_t len,int unset,int last_is_path)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  char cVar9;
  char *pcVar10;
  long len_00;
  char *p_00;
  byte bVar11;
  long *plVar12;
  
  uVar7 = 0;
  lVar5 = len;
  do {
    iVar6 = (int)uVar7;
    if ((lVar5 < 1) || (*p == '\0')) goto LAB_0042d018;
    pcVar10 = p + lVar5;
    len_00 = lVar5;
    bVar11 = 0;
    do {
      bVar3 = bVar11;
      if ((*p != ' ') && (p_00 = p, *p != '\t')) goto LAB_0042ce08;
      p = p + 1;
      bVar3 = 1;
      bVar2 = 1 < len_00;
      len_00 = len_00 + -1;
      bVar11 = 1;
    } while (bVar2);
    len_00 = 0;
    p_00 = pcVar10;
LAB_0042ce08:
    cVar1 = *p_00;
    cVar9 = '\x03';
    lVar5 = len_00;
    p = p_00;
    if (((cVar1 != '\n') && (cVar1 != '\r')) &&
       ((cVar1 != '\\' || ((p_00[1] != '\n' && (p_00[1] != '\r')))))) {
      cVar9 = '\x01';
      if ((bool)(last_is_path == 0 & (bVar3 ^ 1))) {
LAB_0042cfd3:
        len = 0xffffffff;
      }
      else if ((last_is_path == 0) || (len_00 != 0)) {
        if (unset != 0) {
          iVar4 = bid_keycmp(p_00,"all",len_00);
          len = len & 0xffffffff;
          if (0 < iVar4) {
            len = 1;
            cVar9 = '\x01';
            goto LAB_0042cfd8;
          }
        }
        bVar11 = cVar1 + 0x9d;
        iVar4 = 0;
        if ((bVar11 < 0x13) && ((0x79e5bU >> (bVar11 & 0x1f) & 1) != 0)) {
          plVar12 = (long *)(&PTR_bid_keyword_keys_c_006ae158)[bVar11];
          pcVar10 = (char *)*plVar12;
          if (pcVar10 == (char *)0x0) {
LAB_0042cf7b:
            len = len & 0xffffffff;
          }
          else {
            do {
              plVar12 = plVar12 + 1;
              iVar4 = bid_keycmp(p_00,pcVar10,len_00);
              if (0 < iVar4) goto LAB_0042cf7b;
              pcVar10 = (char *)*plVar12;
            } while (pcVar10 != (char *)0x0);
            len = len & 0xffffffff;
            iVar4 = 0;
          }
        }
        if (iVar4 == 0) goto LAB_0042cfd3;
        lVar8 = (long)iVar4;
        p = p_00 + lVar8;
        lVar5 = len_00 - lVar8;
        uVar7 = (ulong)(iVar6 + 1);
        cVar9 = '\0';
        if (p_00[lVar8] == '=') {
          p = p + 1;
          if (lVar5 < 2) {
            lVar5 = lVar5 + -1;
            bVar11 = 1;
          }
          else {
            len = len & 0xffffffff;
            bVar11 = 1;
            do {
              if ((*p == ' ') || (*p == '\t')) {
                lVar5 = lVar5 + -1;
                goto LAB_0042cffc;
              }
              p = p + 1;
              lVar5 = lVar5 + -1;
              bVar11 = 0;
            } while (1 < lVar5);
            lVar5 = 0;
            p = p_00 + len_00;
          }
LAB_0042cffc:
          cVar9 = unset == 0 & bVar11;
          len = len & 0xffffffff;
          if ((bool)cVar9) {
            len = 0xffffffff;
          }
        }
      }
      else {
        len = uVar7;
        lVar5 = 0;
      }
    }
LAB_0042cfd8:
    iVar4 = (int)len;
  } while (cVar9 == '\0');
  iVar6 = (int)uVar7;
  if (cVar9 == '\x03') {
LAB_0042d018:
    iVar4 = iVar6;
  }
  return iVar4;
}

Assistant:

static int
bid_keyword_list(const char *p,  ssize_t len, int unset, int last_is_path)
{
	int l;
	int keycnt = 0;

	while (len > 0 && *p) {
		int blank = 0;

		/* Test whether there are blank characters in the line. */
		while (len >0 && (*p == ' ' || *p == '\t')) {
			++p;
			--len;
			blank = 1;
		}
		if (*p == '\n' || *p == '\r')
			break;
		if (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r'))
			break;
		if (!blank && !last_is_path) /* No blank character. */
			return (-1);
		if (last_is_path && len == 0)
				return (keycnt);

		if (unset) {
			l = bid_keycmp(p, "all", len);
			if (l > 0)
				return (1);
		}
		/* Test whether there is a correct key in the line. */
		l = bid_keyword(p, len);
		if (l == 0)
			return (-1);/* Unknown keyword was found. */
		p += l;
		len -= l;
		keycnt++;

		/* Skip value */
		if (*p == '=') {
			int value = 0;
			++p;
			--len;
			while (len > 0 && *p != ' ' && *p != '\t') {
				++p;
				--len;
				value = 1;
			}
			/* A keyword should have a its value unless
			 * "/unset" operation. */ 
			if (!unset && value == 0)
				return (-1);
		}
	}
	return (keycnt);
}